

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O1

x86Reg __thiscall CodeGenGenericContext::GetReg(CodeGenGenericContext *this)

{
  uint uVar1;
  x86Reg xVar2;
  uint uVar3;
  
  do {
    uVar1 = this->currFreeReg;
    uVar3 = uVar1 + 1;
    if ((ulong)uVar1 == 7) {
      uVar3 = 0;
    }
    xVar2 = GetReg::regs[uVar1];
    this->currFreeReg = uVar3;
  } while ((xVar2 == this->lockedRegA) || (xVar2 == this->lockedRegB));
  return xVar2;
}

Assistant:

x86Reg CodeGenGenericContext::GetReg()
{
#if defined(_M_X64)
	static x86Reg regs[] = { rRAX, rRDX, rEDI, rESI, rR8, rR9, rR10, rR11, rR12 };

	// Simple rotation
	x86Reg res = regs[currFreeReg];

	if(res == rR11)
		currFreeReg = 0;
	else
		currFreeReg += 1;
#else
	static x86Reg regs[] = { rEAX, rEDX, rEDI, rECX };

	// Simple rotation
	x86Reg res = regs[currFreeReg];

	if(res == rECX)
		currFreeReg = 0;
	else
		currFreeReg += 1;
#endif

	if(res == lockedRegA || res == lockedRegB)
		return GetReg();

	return res;
}